

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

CType * lj_cdata_index(CTState *cts,GCcdata *cd,cTValue *key,uint8_t **pp,CTInfo *qual)

{
  char cVar1;
  ushort uVar2;
  double dVar3;
  uint uVar4;
  CTSize CVar5;
  CType *pCVar6;
  ulong uVar7;
  CType *s;
  CType *ct;
  GCstr *name;
  GCcdata *pGVar8;
  ptrdiff_t idx;
  CTSize ofs;
  ulong local_50;
  uint local_44;
  GCcdata *local_40;
  cTValue *local_38;
  
  pGVar8 = cd + 1;
  uVar7 = (ulong)cd->ctypeid;
  pCVar6 = cts->tab;
  if ((pCVar6[uVar7].info & 0xf0800000) == 0x20800000) {
    pGVar8 = (GCcdata *)(pGVar8->nextgc).gcptr64;
    uVar7 = (ulong)(pCVar6[uVar7].info & 0xffff);
  }
  ct = pCVar6 + uVar7;
  local_40 = cd;
  local_38 = key;
  do {
    uVar4 = ct->info;
    if (uVar4 >> 0x1c == 8) {
      if ((uVar4 & 0xff0000) == 0x10000) {
        *qual = *qual | ct->size;
        uVar4 = (uint)(ushort)ct->info;
      }
    }
    else {
      dVar3 = local_38->n;
      uVar7 = (long)dVar3 >> 0x2f;
      if (uVar7 < 0xfffffffffffffff2) {
        local_50 = (ulong)dVar3;
LAB_00144c82:
        if ((uVar4 & 0xe0000000) == 0x20000000) {
          CVar5 = lj_ctype_size(cts,uVar4 & 0xffff);
          if (CVar5 != 0xffffffff) {
            uVar4 = ct->info;
            if ((uVar4 & 0xf0000000) == 0x20000000) {
              if (ct->size == 4) {
                pGVar8 = (GCcdata *)(ulong)(uint)(pGVar8->nextgc).gcptr64;
              }
              else {
                pGVar8 = (GCcdata *)(pGVar8->nextgc).gcptr64;
              }
            }
            else if ((uVar4 & 0xc000000) != 0) {
              if ((uVar4 >> 0x1a & 1) != 0) {
                local_50 = local_50 & 1;
              }
              *(byte *)((long)qual + 3) = *(byte *)((long)qual + 3) | 2;
            }
            *pp = (uint8_t *)((long)&(pGVar8->nextgc).gcptr64 + (long)(int)CVar5 * local_50);
            return ct;
          }
          lj_err_caller(cts->L,LJ_ERR_FFI_INVSIZE);
        }
      }
      else if (uVar7 == 0xfffffffffffffffb) {
        name = (GCstr *)((ulong)dVar3 & 0x7fffffffffff);
        if (uVar4 >> 0x1c == 1) {
          pCVar6 = lj_ctype_getfieldq(cts,ct,name,&local_44,qual);
          if (pCVar6 != (CType *)0x0) {
            *pp = (uint8_t *)((long)&(pGVar8->nextgc).gcptr64 + (ulong)local_44);
            return pCVar6;
          }
        }
        else if ((uVar4 & 0xf4000000) == 0x34000000) {
          if (name->len == 2) {
            *(byte *)((long)qual + 3) = *(byte *)((long)qual + 3) | 2;
            cVar1 = (char)name[1].nextgc.gcptr64;
            if (cVar1 == 'i') {
              if (*(char *)((long)&name[1].nextgc.gcptr64 + 1) == 'm') {
                pGVar8 = (GCcdata *)((long)&(pGVar8->nextgc).gcptr64 + (ulong)(ct->size >> 1));
                goto LAB_00144f53;
              }
            }
            else if ((cVar1 == 'r') && (*(char *)((long)&name[1].nextgc.gcptr64 + 1) == 'e')) {
LAB_00144f53:
              *pp = (uint8_t *)pGVar8;
              return ct;
            }
          }
        }
        else if (local_40->ctypeid == 0x16) {
          uVar7 = (ulong)(uint)(pGVar8->nextgc).gcptr64;
          uVar4 = pCVar6[uVar7].info;
          if ((uVar4 & 0xf0000000) == 0x20000000) {
            uVar7 = (ulong)(uVar4 & 0xffff);
            uVar4 = pCVar6[uVar7].info;
          }
          ct = pCVar6 + uVar7;
          if ((((uVar4 & 0xf0000000) == 0x10000000) &&
              (pCVar6 = lj_ctype_getfieldq(cts,ct,name,&local_44,(CTInfo *)0x0),
              pCVar6 != (CType *)0x0)) && ((pCVar6->info & 0xf0000000) == 0xb0000000)) {
            return pCVar6;
          }
        }
      }
      else if (uVar7 == 0xfffffffffffffff5) {
        uVar2 = *(ushort *)(((ulong)dVar3 & 0x7fffffffffff) + 10);
        uVar4 = pCVar6[uVar2].info;
        if ((uVar4 & 0xf0000000) == 0x50000000) {
          s = pCVar6 + (uVar4 & 0xffff);
          uVar4 = s->info;
        }
        else {
          s = pCVar6 + uVar2;
        }
        if (uVar4 < 0x4000000) {
          lj_cconv_ct_ct(cts,pCVar6 + 0xb,s,(uint8_t *)&local_50,
                         (uint8_t *)(((ulong)dVar3 & 0x7fffffffffff) + 0x10),0);
          uVar4 = ct->info;
          goto LAB_00144c82;
        }
      }
      uVar4 = ct->info;
      if (((uVar4 & 0xf0000000) != 0x20000000) ||
         (pCVar6 = cts->tab, (pCVar6[uVar4 & 0xffff].info & 0xf0000000) != 0x10000000)) {
        *(byte *)qual = (byte)*qual | 1;
        return ct;
      }
      if (ct->size == 4) {
        pGVar8 = (GCcdata *)(ulong)(uint)(pGVar8->nextgc).gcptr64;
      }
      else {
        pGVar8 = (GCcdata *)(pGVar8->nextgc).gcptr64;
      }
    }
    ct = pCVar6 + (uVar4 & 0xffff);
  } while( true );
}

Assistant:

CType *lj_cdata_index(CTState *cts, GCcdata *cd, cTValue *key, uint8_t **pp,
		      CTInfo *qual)
{
  uint8_t *p = (uint8_t *)cdataptr(cd);
  CType *ct = ctype_get(cts, cd->ctypeid);
  ptrdiff_t idx;

  /* Resolve reference for cdata object. */
  if (ctype_isref(ct->info)) {
    lj_assertCTS(ct->size == CTSIZE_PTR, "ref is not pointer-sized");
    p = *(uint8_t **)p;
    ct = ctype_child(cts, ct);
  }

collect_attrib:
  /* Skip attributes and collect qualifiers. */
  while (ctype_isattrib(ct->info)) {
    if (ctype_attrib(ct->info) == CTA_QUAL) *qual |= ct->size;
    ct = ctype_child(cts, ct);
  }
  /* Interning rejects refs to refs. */
  lj_assertCTS(!ctype_isref(ct->info), "bad ref of ref");

  if (tvisint(key)) {
    idx = (ptrdiff_t)intV(key);
    goto integer_key;
  } else if (tvisnum(key)) {  /* Numeric key. */
#ifdef _MSC_VER
    /* Workaround for MSVC bug. */
    volatile
#endif
    lua_Number n = numV(key);
    idx = LJ_64 ? (ptrdiff_t)n : (ptrdiff_t)lj_num2int(n);
  integer_key:
    if (ctype_ispointer(ct->info)) {
      CTSize sz = lj_ctype_size(cts, ctype_cid(ct->info));  /* Element size. */
      if (sz == CTSIZE_INVALID)
	lj_err_caller(cts->L, LJ_ERR_FFI_INVSIZE);
      if (ctype_isptr(ct->info)) {
	p = (uint8_t *)cdata_getptr(p, ct->size);
      } else if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
	if ((ct->info & CTF_COMPLEX)) idx &= 1;
	*qual |= CTF_CONST;  /* Valarray elements are constant. */
      }
      *pp = p + idx*(int32_t)sz;
      return ct;
    }
  } else if (tviscdata(key)) {  /* Integer cdata key. */
    GCcdata *cdk = cdataV(key);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    if (ctype_isenum(ctk->info)) ctk = ctype_child(cts, ctk);
    if (ctype_isinteger(ctk->info)) {
      lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT_PSZ), ctk,
		     (uint8_t *)&idx, cdataptr(cdk), 0);
      goto integer_key;
    }
  } else if (tvisstr(key)) {  /* String key. */
    GCstr *name = strV(key);
    if (ctype_isstruct(ct->info)) {
      CTSize ofs;
      CType *fct = lj_ctype_getfieldq(cts, ct, name, &ofs, qual);
      if (fct) {
	*pp = p + ofs;
	return fct;
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2) {
	*qual |= CTF_CONST;  /* Complex fields are constant. */
	if (strdata(name)[0] == 'r' && strdata(name)[1] == 'e') {
	  *pp = p;
	  return ct;
	} else if (strdata(name)[0] == 'i' && strdata(name)[1] == 'm') {
	  *pp = p + (ct->size >> 1);
	  return ct;
	}
      }
    } else if (cd->ctypeid == CTID_CTYPEID) {
      /* Allow indexing a (pointer to) struct constructor to get constants. */
      CType *sct = ctype_raw(cts, *(CTypeID *)p);
      if (ctype_isptr(sct->info))
	sct = ctype_rawchild(cts, sct);
      if (ctype_isstruct(sct->info)) {
	CTSize ofs;
	CType *fct = lj_ctype_getfield(cts, sct, name, &ofs);
	if (fct && ctype_isconstval(fct->info))
	  return fct;
      }
      ct = sct;  /* Allow resolving metamethods for constructors, too. */
    }
  }
  if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
    if (ctype_isstruct(ctype_rawchild(cts, ct)->info)) {
      p = (uint8_t *)cdata_getptr(p, ct->size);
      ct = ctype_child(cts, ct);
      goto collect_attrib;
    }
  }
  *qual |= 1;  /* Lookup failed. */
  return ct;  /* But return the resolved raw type. */
}